

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool global_collect_tree(Node *node,IdentTree *tree)

{
  pointer ppNVar1;
  Node *pNVar2;
  long lVar3;
  bool bVar4;
  IdentTree *pIVar5;
  _Rb_tree_header *p_Var6;
  NodeType NVar7;
  size_t i;
  Node *pNVar8;
  ulong uVar9;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  pointer local_50;
  pointer local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (tree == (IdentTree *)0x0 || node == (Node *)0x0) {
    return false;
  }
  NVar7 = node->nodeType;
  if (NVar7 == PNT_BINARY_OP) {
    if (node->tok->type != TK_NEWSLOT) {
      return false;
    }
    node_to_path_abi_cxx11_
              (&path,*(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    pIVar5 = (IdentTree *)operator_new(0x48);
    (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var6 = &(pIVar5->children)._M_t._M_impl.super__Rb_tree_header;
    (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
    (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
    (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pIVar5->extends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar5->extends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar5->extends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = global_collect_tree((node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[1],pIVar5);
    if (!bVar4) {
      IdentTree::~IdentTree(pIVar5);
      operator_delete(pIVar5);
      pIVar5 = (IdentTree *)0x0;
    }
    set_sub_tree_by_path(tree,pIVar5,&path);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&path);
    NVar7 = node->nodeType;
  }
  else if (NVar7 == PNT_STATEMENT_LIST) {
    uVar9 = 0;
    do {
      ppNVar1 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <= uVar9) {
        return true;
      }
      pNVar2 = ppNVar1[uVar9];
      if (pNVar2 != (Node *)0x0) {
        NVar7 = pNVar2->nodeType;
        if (NVar7 == PNT_BINARY_OP) {
          if (pNVar2->tok->type == TK_NEWSLOT) {
            pNVar8 = *(pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                      .super__Vector_impl_data._M_start;
LAB_001154f6:
            node_to_path_abi_cxx11_(&path,pNVar8);
            pIVar5 = (IdentTree *)operator_new(0x48);
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            p_Var6 = &(pIVar5->children)._M_t._M_impl.super__Rb_tree_header;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var6->_M_header;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var6->_M_header;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            (pIVar5->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pIVar5->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pIVar5->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pNVar8 = pNVar2;
            if (pNVar2->nodeType == PNT_BINARY_OP) {
              pNVar8 = (pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[1];
            }
            bVar4 = global_collect_tree(pNVar8,pIVar5);
            if (!bVar4) {
              IdentTree::~IdentTree(pIVar5);
              operator_delete(pIVar5);
              pIVar5 = (IdentTree *)0x0;
            }
            set_sub_tree_by_path(tree,pIVar5,&path);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&path);
            NVar7 = pNVar2->nodeType;
LAB_00115576:
            if (NVar7 == PNT_FUNCTION) {
              node_to_path_abi_cxx11_
                        (&path,*(pNVar2->children).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
              set_sub_tree_by_path(tree,(IdentTree *)0x0,&path);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&path);
              NVar7 = pNVar2->nodeType;
            }
            if (NVar7 == PNT_GLOBAL_ENUM) {
              std::__cxx11::string::string
                        ((string *)&local_50,
                         ((*(pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start)->tok->u).s,&local_79);
              path.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&path.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (local_50 != (pointer)&local_40) {
                path.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = local_50;
              }
              path.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT71(uStack_3f,local_40);
              path.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = local_48;
              local_48 = (pointer)0x0;
              local_40 = 0;
              local_50 = (pointer)&local_40;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IdentTree*>,std::_Select1st<std::pair<std::__cxx11::string_const,IdentTree*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IdentTree*>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,decltype(nullptr)>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IdentTree*>,std::_Select1st<std::pair<std::__cxx11::string_const,IdentTree*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IdentTree*>>>
                          *)&ident_root,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::nullptr_t>
                          *)&path);
              std::__cxx11::string::~string((string *)&path);
              std::__cxx11::string::~string((string *)&local_50);
              NVar7 = pNVar2->nodeType;
            }
            if (NVar7 == PNT_IF_ELSE) {
              global_collect_tree((pNVar2->children).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[1],tree);
              ppNVar1 = (pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (0x10 < (ulong)((long)(pNVar2->children).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)ppNVar1)) {
                global_collect_tree(ppNVar1[2],tree);
              }
            }
          }
        }
        else {
          if ((NVar7 & ~PNT_NULL) != PNT_CLASS) goto LAB_00115576;
          pNVar8 = *(pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pNVar8 != (Node *)0x0) goto LAB_001154f6;
        }
        if ((((pNVar2->nodeType == PNT_LOCAL_VAR_DECLARATION) &&
             (ppNVar1 = (pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
             (pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish != ppNVar1)) &&
            (pNVar2 = *ppNVar1, pNVar2->nodeType == PNT_VAR_DECLARATOR)) &&
           (ppNVar1 = (pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                      .super__Vector_impl_data._M_start,
           (long)(pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppNVar1 == 0x10)) {
          pNVar2 = ppNVar1[1];
          if (((pNVar2 != (Node *)0x0 && *ppNVar1 != (Node *)0x0) && (pNVar2->nodeType == PNT_CLASS)
              ) && ((pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start[1] != (Node *)0x0)) {
            node_to_path_abi_cxx11_(&path,*ppNVar1);
            pIVar5 = (IdentTree *)operator_new(0x48);
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            p_Var6 = &(pIVar5->children)._M_t._M_impl.super__Rb_tree_header;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var6->_M_header;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var6->_M_header;
            (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            (pIVar5->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pIVar5->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pIVar5->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            global_collect_tree(pNVar2,pIVar5);
            set_sub_tree_by_path(tree,pIVar5,&path);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&path);
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while( true );
  }
  if (PNT_LOCAL_CLASS < NVar7) {
    return false;
  }
  if ((0x30000004000000U >> ((ulong)NVar7 & 0x3f) & 1) != 0) {
    if ((NVar7 & ~PNT_NULL) == PNT_CLASS) {
      pNVar2 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      uVar9 = 3;
      if (pNVar2 != (Node *)0x0) {
        node_to_path_abi_cxx11_(&path,pNVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&tree->extends,&path);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&path);
      }
    }
    else {
      uVar9 = 0;
    }
    for (; ppNVar1 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
        uVar9 = uVar9 + 1) {
      pNVar2 = ppNVar1[uVar9];
      if (((pNVar2 != (Node *)0x0) && ((ulong)pNVar2->nodeType < 0x3d)) &&
         (((0x1800000000000100U >> ((ulong)pNVar2->nodeType & 0x3f) & 1) != 0 &&
          (pNVar8 = (Node *)*(pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_start, pNVar8 != (Node *)0x0)))) {
        node_to_path_abi_cxx11_(&path,pNVar8);
        pIVar5 = (IdentTree *)operator_new(0x48);
        (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        p_Var6 = &(pIVar5->children)._M_t._M_impl.super__Rb_tree_header;
        (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header
        ;
        (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var6->_M_header;
        (pIVar5->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        (pIVar5->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pIVar5->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pIVar5->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar3 = *(long *)&(pNVar2->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data;
        if (((ulong)((long)*(pointer *)
                            ((long)&(pNVar2->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl + 8)
                    - lVar3) < 9) ||
           (bVar4 = global_collect_tree(*(Node **)(lVar3 + 8),pIVar5), !bVar4)) {
          IdentTree::~IdentTree(pIVar5);
          operator_delete(pIVar5);
          pIVar5 = (IdentTree *)0x0;
        }
        set_sub_tree_by_path(tree,pIVar5,&path);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&path);
      }
    }
    return true;
  }
  return false;
}

Assistant:

static bool global_collect_tree(Node * node, IdentTree * tree)
{
  if (!node || !tree)
    return false;

  if (node->nodeType == PNT_BINARY_OP && node->tok.type == TK_NEWSLOT)
  {
    vector<string> path = node_to_path(node->children[0]);
    IdentTree * subTree = new IdentTree;
    if (!global_collect_tree(node->children[1], subTree))
    {
      delete subTree;
      subTree = nullptr;
    }
    set_sub_tree_by_path(tree, subTree, path);
  }
  else if (node->nodeType == PNT_STATEMENT_LIST) // root
  {
    for (size_t i = 0; i < node->children.size(); i++)
    {
      Node * cur = node->children[i];
      if (!cur)
        continue;

      if ((cur->nodeType == PNT_BINARY_OP && cur->tok.type == TK_NEWSLOT) ||
        ((cur->nodeType == PNT_CLASS || cur->nodeType == PNT_LOCAL_CLASS) && cur->children[0]))
      {
        vector<string> path = node_to_path(cur->children[0]);
        IdentTree * subTree = new IdentTree;
        if (!global_collect_tree(cur->nodeType == PNT_BINARY_OP ? cur->children[1] : cur, subTree))
        {
          delete subTree;
          subTree = nullptr;
        }
        set_sub_tree_by_path(tree, subTree, path);
      }

      if (cur->nodeType == PNT_FUNCTION)
      {
        vector<string> path = node_to_path(cur->children[0]);
        set_sub_tree_by_path(tree, nullptr, path);
      }

      if (cur->nodeType == PNT_GLOBAL_ENUM)
      {
        ident_root.children.insert(make_pair(string(cur->children[0]->tok.u.s), nullptr));
      }

      if (cur->nodeType == PNT_IF_ELSE)
      {
        global_collect_tree(cur->children[1], tree);
        if (cur->children.size() > 2) // else-node
          global_collect_tree(cur->children[2], tree);
      }


      // local ClassName = class extends XXXX {}
      if (cur->nodeType == PNT_LOCAL_VAR_DECLARATION && cur->children.size() > 0 &&
        cur->children[0]->nodeType == PNT_VAR_DECLARATOR && cur->children[0]->children.size() == 2)
      {
        Node * nameNode = cur->children[0]->children[0];
        Node * classNode = cur->children[0]->children[1];
        if (nameNode && classNode && classNode->nodeType == PNT_CLASS && classNode->children[1]) // children[1] - extends
        {
          vector<string> path = node_to_path(nameNode);
          IdentTree * subTree = new IdentTree;
          global_collect_tree(classNode, subTree);
          set_sub_tree_by_path(tree, subTree, path);
        }
      }
    }
    return true;
  }

  if (node->nodeType == PNT_TABLE_CREATION || node->nodeType == PNT_CLASS || node->nodeType == PNT_LOCAL_CLASS)
  {
    bool isClass = (node->nodeType == PNT_CLASS || node->nodeType == PNT_LOCAL_CLASS);
    if (isClass && node->children[1])
      tree->extends = node_to_path(node->children[1]);

    for (size_t i = isClass ? 3 : 0; i < node->children.size(); i++)
    {
      Node * cur = node->children[i];
      if (!cur)
        continue;

      if (cur->nodeType == PNT_KEY_VALUE || cur->nodeType == PNT_CLASS_MEMBER || cur->nodeType == PNT_STATIC_CLASS_MEMBER)
        if (cur->children[0])
        {
          vector<string> path = node_to_path(cur->children[0]);
          IdentTree * subTree = new IdentTree;
          if (cur->children.size() < 2 || !global_collect_tree(cur->children[1], subTree))
          {
            delete subTree;
            subTree = nullptr;
          }
          set_sub_tree_by_path(tree, subTree, path);
        }
    }
    return true;
  }

  return false;
}